

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O1

bool __thiscall
gss::innards::Lackey::check_solution
          (Lackey *this,VertexToVertexMapping *m,bool partial,bool all_solutions,
          function<bool_(int,_int)> *deletion)

{
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> _Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  istream *piVar8;
  long *plVar9;
  optional<int> oVar10;
  optional<int> oVar11;
  DisobedientLackeyError *pDVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined7 in_register_00000009;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined7 in_register_00000011;
  string_view n_00;
  string_view n_01;
  int n;
  string k;
  string v;
  int m_1;
  string operation;
  string response;
  string command;
  unique_lock<std::mutex> lock;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  int local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  int local_16c;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  _Storage<int,_true> local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unique_lock<std::mutex> local_40;
  
  local_16c = (int)CONCAT71(in_register_00000009,all_solutions);
  local_40._M_device =
       &((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
         .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
        external_solver_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->number_of_calls = (_Var1._M_head_impl)->number_of_calls + 1;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,partial) == 0) {
    (_Var1._M_head_impl)->number_of_checks = (_Var1._M_head_impl)->number_of_checks + 1;
    __s = "F";
    if ((char)local_16c != '\0') {
      __s = "A";
    }
  }
  else if ((deletion->super__Function_base)._M_manager == (_Manager_type)0x0) {
    (_Var1._M_head_impl)->number_of_checks = (_Var1._M_head_impl)->number_of_checks + 1;
    __s = "C";
  }
  else {
    (_Var1._M_head_impl)->number_of_propagations = (_Var1._M_head_impl)->number_of_propagations + 1;
    __s = "P";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_e8,0,0,__s,1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                       send_to,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  for (p_Var7 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = (ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
               .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->send_to;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    InputGraph::vertex_name_abi_cxx11_
              (&local_168,
               ((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
               pattern_graph,p_Var7[1]._M_color);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_168._M_dataplus._M_p,local_168._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    InputGraph::vertex_name_abi_cxx11_
              (&local_128,
               ((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
               target_graph,*(int *)&p_Var7[1].field_0x4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_128._M_dataplus._M_p,local_128._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
  }
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  cVar2 = (char)_Var1._M_head_impl + '(';
  std::ios::widen((char)*(undefined8 *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  if ((*(byte *)((long)&(_Var1._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18)) & 5) != 0) {
    pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"error giving lackey its orders","");
    DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_168);
    __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  piVar8 = std::operator>>((istream *)&(_Var1._M_head_impl)->read_from,(string *)&local_168);
  if (((((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) ||
      (local_168._M_string_length != local_e8._M_string_length)) ||
     ((local_168._M_string_length != 0 &&
      (iVar4 = bcmp(local_168._M_dataplus._M_p,local_e8._M_dataplus._M_p,local_168._M_string_length)
      , iVar4 != 0)))) {
    pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_190,"asked lackey to ",&local_e8);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_190,", but it replied with \'");
    local_1b8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar14) {
      local_1b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1b8._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_1d8,&local_1b8,&local_168);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1d8,"\'");
    local_128._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == paVar14) {
      local_128.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_128._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_128);
    __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_allocated_capacity =
       local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
  piVar8 = std::operator>>((istream *)
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl
                            )->read_from,(string *)&local_128);
  if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
    pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_1b8,"asked lackey to ",&local_e8);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1b8,", but it gave no T/F");
    local_1d8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar14) {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_1d8);
    __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_128,"T");
  if ((iVar4 != 0) &&
     (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_128,"F"), iVar5 != 0)) {
    pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::operator+(&local_a8,"asked lackey to ",&local_e8);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_a8," but it replied with \'");
    local_148._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == paVar14) {
      local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_148._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_148,&local_168);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "\' then \'");
    local_190._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == paVar14) {
      local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_190._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_1b8,&local_190,&local_128);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1b8,"\'");
    local_1d8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar14) {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_1d8);
    __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  plVar9 = (long *)std::istream::operator>>
                             (&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                               _M_head_impl)->read_from,&local_1dc);
  if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
    pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_148,local_1dc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "lackey replied with length \'",&local_148);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "\' to ");
    local_190._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == paVar14) {
      local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_190._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_1b8,&local_190,&local_e8);
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1b8," query");
    local_1d8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar14 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar14) {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_1d8);
    __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_e8,"S");
  local_84 = iVar4;
  if (iVar5 == 0) {
    if (0 < local_1dc) {
      iVar4 = 0;
      do {
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity =
             local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity =
             local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        piVar8 = std::operator>>((istream *)
                                 &((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                  _M_head_impl)->read_from,(string *)&local_1d8);
        piVar8 = std::operator>>(piVar8,(string *)&local_1b8);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
          pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_c8,iVar4);
          std::operator+(&local_a8,"lackey gave bad response pair ",&local_c8);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_a8," to ");
          local_148._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar14 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p == paVar14) {
            local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_148._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_148,&local_e8);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108," query");
          local_190._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar14 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar14) {
            local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          }
          else {
            local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_190._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_190);
          __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_1dc);
    }
  }
  else {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_e8,"C");
    if (((iVar4 == 0) ||
        (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&local_e8,"P"), iVar4 == 0)) && (0 < local_1dc)) {
      iVar4 = 0;
      do {
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity =
             local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity =
             local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        piVar8 = std::operator>>((istream *)
                                 &((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                  _M_head_impl)->read_from,(string *)&local_1d8);
        plVar9 = (long *)std::istream::operator>>(piVar8,&local_194);
        if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
          pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
          std::operator+(&local_60,"lackey gave bad response pair ",&local_1d8);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_60," ");
          local_c8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar14 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == paVar14) {
            local_c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_c8._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::to_string(&local_80,local_194);
          std::operator+(&local_a8,&local_c8,&local_80);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_a8," to ");
          local_148._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar14 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p == paVar14) {
            local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_148._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_148,&local_e8);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108," query");
          local_190._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar14 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar14) {
            local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          }
          else {
            local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_190._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_190);
          __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        n_00._M_str = local_1d8._M_dataplus._M_p;
        n_00._M_len = local_1d8._M_string_length;
        local_16c = iVar4;
        oVar10 = InputGraph::vertex_from_name
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl
                            )->pattern_graph,n_00);
        if (0 < local_194) {
          iVar4 = 0;
          do {
            piVar8 = std::operator>>((istream *)
                                     &((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                      _M_head_impl)->read_from,(string *)&local_1b8);
            if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
              pDVar12 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
              std::operator+(&local_60,"lackey gave bad response pair ",&local_1d8);
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_60," ");
              local_c8._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar14 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p == paVar14) {
                local_c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              }
              local_c8._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::to_string(&local_80,local_194);
              std::operator+(&local_a8,&local_c8,&local_80);
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_a8," to ");
              local_148._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar14 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p == paVar14) {
                local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              }
              else {
                local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              }
              local_148._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,&local_148,&local_e8);
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108," query");
              local_190._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar14 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p == paVar14) {
                local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              }
              else {
                local_190.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              }
              local_190._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              DisobedientLackeyError::DisobedientLackeyError(pDVar12,&local_190);
              __cxa_throw(pDVar12,&DisobedientLackeyError::typeinfo,
                          DisobedientLackeyError::~DisobedientLackeyError);
            }
            if ((((deletion->super__Function_base)._M_manager != (_Manager_type)0x0) &&
                (n_01._M_str = local_1b8._M_dataplus._M_p, n_01._M_len = local_1b8._M_string_length,
                oVar11 = InputGraph::vertex_from_name
                                   (((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                    _M_head_impl)->target_graph,n_01),
                ((ulong)oVar10.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int> & 0x100000000) != 0)) &&
               (((ulong)oVar11.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int> & 0x100000000) != 0)) {
              local_190._M_dataplus._M_p._0_4_ =
                   oVar10.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload;
              local_108[0]._M_value =
                   oVar11.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload;
              if ((deletion->super__Function_base)._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              bVar3 = (*deletion->_M_invoker)
                                ((_Any_data *)deletion,(int *)&local_190,&local_108[0]._M_value);
              if (bVar3) {
                plVar9 = &((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)
                          ->number_of_deletions;
                *plVar9 = *plVar9 + 1;
              }
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < local_194);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        iVar4 = local_16c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_1dc);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  iVar4 = local_84;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return iVar4 == 0;
}

Assistant:

auto Lackey::check_solution(
    const VertexToVertexMapping & m,
    bool partial,
    bool all_solutions,
    const function<auto(int, int)->bool> & deletion) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command;
    if (partial) {
        if (deletion) {
            ++_imp->number_of_propagations;
            command = "P";
        }
        else {
            ++_imp->number_of_checks;
            command = "C";
        }
    }
    else {
        ++_imp->number_of_checks;
        if (all_solutions)
            command = "A";
        else
            command = "F";
    }

    _imp->send_to << command << " " << m.size();
    for (auto & [p, t] : m)
        _imp->send_to << " " << _imp->pattern_graph.vertex_name(p) << " " << _imp->target_graph.vertex_name(t);
    _imp->send_to << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    bool result;
    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T")
        result = true;
    else if (response == "F")
        result = false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    if (command == "S") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            if (! (_imp->read_from >> k >> v))
                throw DisobedientLackeyError{"lackey gave bad response pair " + to_string(i) + " to " + command + " query"};
        }
    }
    else if (command == "C" || command == "P") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            int m;
            if (! (_imp->read_from >> k >> m))
                throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};
            auto p = _imp->pattern_graph.vertex_from_name(k);

            for (int j = 0; j < m; ++j) {
                if (! (_imp->read_from >> v))
                    throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};

                if (deletion) {
                    auto t = _imp->target_graph.vertex_from_name(v);
                    if (p && t)
                        if (deletion(*p, *t))
                            ++_imp->number_of_deletions;
                }
            }
        }
    }

    return result;
}